

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
           *this,SVInt *p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  locator lStack_28;
  
  *num_destroyed = *num_destroyed + 1;
  nosize_unchecked_emplace_at<slang::SVInt>
            (&lStack_28,this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,p);
  slang::SVInt::~SVInt(p);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }